

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O3

void __thiscall
helics::MessageDataOperator::MessageDataOperator
          (MessageDataOperator *this,function<void_(helics::SmallBuffer_&)> *userDataFunction)

{
  undefined8 uVar1;
  
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__MessageDataOperator_0053f140;
  *(undefined8 *)&(this->dataFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->dataFunction).super__Function_base._M_functor + 8) = 0;
  (this->dataFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->dataFunction)._M_invoker = userDataFunction->_M_invoker;
  if ((userDataFunction->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(userDataFunction->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->dataFunction).super__Function_base._M_functor =
         *(undefined8 *)&(userDataFunction->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->dataFunction).super__Function_base._M_functor + 8) = uVar1;
    (this->dataFunction).super__Function_base._M_manager =
         (userDataFunction->super__Function_base)._M_manager;
    (userDataFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
    userDataFunction->_M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

MessageDataOperator::MessageDataOperator(std::function<void(SmallBuffer&)> userDataFunction):
    dataFunction(std::move(userDataFunction))
{
}